

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O0

void initBitmap(uchar *buf,int width,int pitch,int height,int pf,int flags)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  undefined1 uVar8;
  uint uVar9;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  uint in_R9D;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  uchar b;
  uchar g;
  uchar r;
  int row;
  int j;
  int i;
  int ps;
  int boffset;
  int goffset;
  int roffset;
  double ktmp;
  double ytmp;
  double mtmp;
  double ctmp;
  double local_a8;
  double local_a0;
  double local_98;
  int local_88;
  int local_7c;
  int local_78;
  double local_40;
  double local_38;
  double local_30;
  
  iVar1 = tjRedOffset[in_R8D];
  iVar2 = tjGreenOffset[in_R8D];
  iVar3 = tjBlueOffset[in_R8D];
  iVar4 = tjPixelSize[in_R8D];
  for (local_7c = 0; local_7c < in_ECX; local_7c = local_7c + 1) {
    if ((in_R9D & 2) == 0) {
      local_88 = local_7c;
    }
    else {
      local_88 = (in_ECX - local_7c) + -1;
    }
    for (local_78 = 0; local_78 < in_ESI; local_78 = local_78 + 1) {
      uVar5 = (long)(local_78 << 8) / (long)in_ESI;
      bVar6 = (byte)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) % 0x100)
      ;
      uVar5 = (long)(local_7c << 8) / (long)in_ECX;
      bVar7 = (byte)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) % 0x100)
      ;
      uVar9 = ((local_7c << 8) / in_ECX + (local_78 << 8) / in_ESI) % 0x100;
      uVar8 = (undefined1)uVar9;
      memset((void *)(in_RDI + (local_88 * in_EDX + local_78 * iVar4)),0,(long)iVar4);
      if (in_R8D == 6) {
        *(undefined1 *)(in_RDI + (local_88 * in_EDX + local_78 * iVar4)) = uVar8;
      }
      else if (in_R8D == 0xb) {
        lVar10 = (long)(local_88 * in_EDX + local_78 * iVar4);
        dVar13 = 1.0 - (double)bVar6 / 255.0;
        dVar11 = 1.0 - (double)bVar7 / 255.0;
        dVar12 = 1.0 - (double)(uVar9 & 0xff) / 255.0;
        local_98 = dVar11;
        if (dVar13 < dVar11) {
          local_98 = dVar13;
        }
        local_a8 = dVar12;
        if (local_98 < dVar12) {
          local_a0 = dVar11;
          if (dVar13 < dVar11) {
            local_a0 = dVar13;
          }
          local_a8 = local_a0;
        }
        if ((local_a8 != 1.0) || (NAN(local_a8))) {
          local_30 = (dVar13 - local_a8) / (1.0 - local_a8);
          local_38 = (dVar11 - local_a8) / (1.0 - local_a8);
          local_40 = (dVar12 - local_a8) / (1.0 - local_a8);
        }
        else {
          local_40 = 0.0;
          local_38 = 0.0;
          local_30 = 0.0;
        }
        *(char *)(in_RDI + lVar10) = (char)(int)((255.0 - local_30 * 255.0) + 0.5);
        *(char *)(in_RDI + 1 + lVar10) = (char)(int)((255.0 - local_38 * 255.0) + 0.5);
        *(char *)(in_RDI + 2 + lVar10) = (char)(int)((255.0 - local_40 * 255.0) + 0.5);
        *(char *)(in_RDI + 3 + lVar10) = (char)(int)((255.0 - local_a8 * 255.0) + 0.5);
      }
      else {
        *(byte *)(in_RDI + (local_88 * in_EDX + local_78 * iVar4 + iVar1)) = bVar6;
        *(byte *)(in_RDI + (local_88 * in_EDX + local_78 * iVar4 + iVar2)) = bVar7;
        *(undefined1 *)(in_RDI + (local_88 * in_EDX + local_78 * iVar4 + iVar3)) = uVar8;
      }
    }
  }
  return;
}

Assistant:

static void initBitmap(unsigned char *buf, int width, int pitch, int height,
                       int pf, int flags)
{
  int roffset = tjRedOffset[pf];
  int goffset = tjGreenOffset[pf];
  int boffset = tjBlueOffset[pf];
  int ps = tjPixelSize[pf];
  int i, j;

  for (j = 0; j < height; j++) {
    int row = (flags & TJFLAG_BOTTOMUP) ? height - j - 1 : j;

    for (i = 0; i < width; i++) {
      unsigned char r = (i * 256 / width) % 256;
      unsigned char g = (j * 256 / height) % 256;
      unsigned char b = (j * 256 / height + i * 256 / width) % 256;

      memset(&buf[row * pitch + i * ps], 0, ps);
      if (pf == TJPF_GRAY) buf[row * pitch + i * ps] = b;
      else if (pf == TJPF_CMYK)
        rgb_to_cmyk(r, g, b, &buf[row * pitch + i * ps + 0],
                    &buf[row * pitch + i * ps + 1],
                    &buf[row * pitch + i * ps + 2],
                    &buf[row * pitch + i * ps + 3]);
      else {
        buf[row * pitch + i * ps + roffset] = r;
        buf[row * pitch + i * ps + goffset] = g;
        buf[row * pitch + i * ps + boffset] = b;
      }
    }
  }
}